

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::Model::set_allocated_gazetteer(Model *this,Gazetteer *gazetteer)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_Type(this);
  if (gazetteer != (Gazetteer *)0x0) {
    uVar1 = (gazetteer->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar1 & 2) == 0) {
      submessage_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        submessage_arena = *(Arena **)submessage_arena;
      }
    }
    else {
      submessage_arena = (Arena *)0x0;
    }
    if (message_arena != submessage_arena) {
      gazetteer = (Gazetteer *)
                  google::protobuf::internal::GetOwnedMessageInternal
                            (message_arena,&gazetteer->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 0x7d4;
    (this->Type_).gazetteer_ = gazetteer;
  }
  return;
}

Assistant:

void Model::set_allocated_gazetteer(::CoreML::Specification::CoreMLModels::Gazetteer* gazetteer) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_Type();
  if (gazetteer) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
        ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<
            ::PROTOBUF_NAMESPACE_ID::MessageLite>::GetOwningArena(
                reinterpret_cast<::PROTOBUF_NAMESPACE_ID::MessageLite*>(gazetteer));
    if (message_arena != submessage_arena) {
      gazetteer = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, gazetteer, submessage_arena);
    }
    set_has_gazetteer();
    Type_.gazetteer_ = gazetteer;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.Model.gazetteer)
}